

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void gai_FindOffset(Integer ndim,Integer *lo,Integer *plo,Integer *ld,Integer *offset)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  
  *offset = 0;
  if (0 < ndim) {
    IVar1 = *offset;
    lVar2 = 1;
    lVar3 = 0;
    do {
      IVar1 = (plo[lVar3] - lo[lVar3]) * lVar2 + IVar1;
      *offset = IVar1;
      if (lVar3 < ndim + -1) {
        lVar2 = lVar2 * ld[lVar3];
      }
      lVar3 = lVar3 + 1;
    } while (ndim != lVar3);
  }
  return;
}

Assistant:

void  gai_FindOffset(Integer ndim,Integer *lo, Integer *plo,
    Integer *ld, Integer *offset)
{
  Integer i, factor;
  *offset = 0;
  factor = 1;
  for (i=0; i<ndim; i++) {
    *offset += (plo[i]-lo[i])*factor; 
    if (i<ndim-1) factor *= ld[i];
  }
}